

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O1

Result * __thiscall
CoreML::LinearModel::setOffsets
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<double,_std::allocator<double>_> *offsets)

{
  RepeatedField<double> *this_00;
  double dVar1;
  uint uVar2;
  uint uVar3;
  Model *this_01;
  ulong uVar4;
  double *pdVar5;
  GLMRegressor *pGVar6;
  double *pdVar7;
  Arena *arena;
  double *pdVar8;
  double tmp;
  
  this_01 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_01->_oneof_case_[0] != 300) {
    Specification::Model::clear_Type(this_01);
    this_01->_oneof_case_[0] = 300;
    uVar4 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pGVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GLMRegressor>(arena)
    ;
    (this_01->Type_).glmregressor_ = pGVar6;
  }
  pdVar8 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar8 != pdVar5) {
    pGVar6 = (this_01->Type_).glmregressor_;
    this_00 = &pGVar6->offset_;
    do {
      dVar1 = *pdVar8;
      uVar2 = (pGVar6->offset_).current_size_;
      uVar3 = (pGVar6->offset_).total_size_;
      if (uVar2 == uVar3) {
        google::protobuf::RepeatedField<double>::Reserve(this_00,uVar3 + 1);
      }
      pdVar7 = google::protobuf::RepeatedField<double>::elements(this_00);
      pdVar7[uVar2] = dVar1;
      this_00->current_size_ = uVar2 + 1;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar5);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setOffsets(std::vector<double> offsets) {
        auto lr = m_spec->mutable_glmregressor();
        for(double n : offsets) {
            lr->add_offset(n);
        }
        return Result();
    }